

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

TransSetSyntax * __thiscall slang::parsing::Parser::parseTransSet(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeParen_00;
  Token openParen_00;
  TransSetSyntax *pTVar1;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token closeParen;
  Token openParen;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_00000140;
  Token *in_stack_00000148;
  TokenKind in_stack_00000152;
  TokenKind in_stack_00000154;
  TokenKind in_stack_00000156;
  ParserBase *in_stack_00000158;
  Token *in_stack_00000170;
  RequireItems in_stack_00000178;
  DiagCode in_stack_00000180;
  anon_class_8_1_8991fb9c *in_stack_00000188;
  AllowEmpty in_stack_00000190;
  SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *ranges;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff1c;
  __extent_storage<18446744073709551615UL> _Var4;
  undefined4 uVar5;
  undefined1 in_stack_ffffffffffffff2c [12];
  undefined1 local_50 [12];
  undefined4 local_44;
  
  Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x8adb14);
  local_44 = 0x10001;
  ranges = (SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *)&stack0xffffffffffffffd0;
  _Var4._M_extent_value = (size_t)local_50;
  uVar2 = 1;
  uVar3 = 0x10001;
  uVar5 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleTransSet,&slang::syntax::SyntaxFacts::isEndOfTransSet,slang::parsing::Parser::parseTransSet()::__0>
            (in_stack_00000158,in_stack_00000156,in_stack_00000154,in_stack_00000152,
             in_stack_00000148,in_stack_00000140,in_stack_00000170,in_stack_00000178,
             in_stack_00000180,in_stack_00000188,in_stack_00000190);
  elements._M_ptr._4_4_ = in_stack_ffffffffffffff1c;
  elements._M_ptr._0_4_ = uVar3;
  elements._M_extent._M_extent_value = _Var4._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *)
             CONCAT44(in_stack_ffffffffffffff14,uVar2),elements);
  openParen_00.rawLen = in_stack_ffffffffffffff2c._0_4_;
  openParen_00.info = (Info *)in_stack_ffffffffffffff2c._4_8_;
  openParen_00.kind = (short)uVar5;
  openParen_00._2_1_ = (char)((uint)uVar5 >> 0x10);
  openParen_00.numFlags.raw = (char)((uint)uVar5 >> 0x18);
  closeParen_00.rawLen = in_stack_ffffffffffffff1c;
  closeParen_00.kind = (short)uVar3;
  closeParen_00._2_1_ = (char)((uint)uVar3 >> 0x10);
  closeParen_00.numFlags.raw = (char)((uint)uVar3 >> 0x18);
  closeParen_00.info = (Info *)_Var4._M_extent_value;
  pTVar1 = slang::syntax::SyntaxFactory::transSet
                     ((SyntaxFactory *)CONCAT44(in_stack_ffffffffffffff14,uVar2),openParen_00,ranges
                      ,closeParen_00);
  return pTVar1;
}

Assistant:

TransSetSyntax& Parser::parseTransSet() {
    Token openParen;
    Token closeParen;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleTransSet, isEndOfTransSet>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::EqualsArrow, openParen,
        list, closeParen, RequireItems::True, diag::ExpectedExpression,
        [this] { return &parseTransRange(); });

    return factory.transSet(openParen, list, closeParen);
}